

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getsym.h
# Opt level: O1

int insertIdentifier(string *str)

{
  pointer __s2;
  size_t sVar1;
  size_t __n;
  pointer pbVar2;
  int iVar3;
  int iVar4;
  pointer pbVar5;
  
  pbVar2 = identifierArray_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = identifierArray_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (identifierArray_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      identifierArray_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar4 = 0;
  }
  else {
    __s2 = (str->_M_dataplus)._M_p;
    sVar1 = str->_M_string_length;
    iVar4 = 0;
    do {
      __n = pbVar5->_M_string_length;
      if ((__n == sVar1) &&
         ((__n == 0 || (iVar3 = bcmp((pbVar5->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) break;
      iVar4 = iVar4 + 1;
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar2);
  }
  if (pbVar5 == pbVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&identifierArray_abi_cxx11_,str);
  }
  return iVar4;
}

Assistant:

int insertIdentifier(const string& str)      //插入到标识符符号表
{
    int location = 0;
    auto itd = identifierArray.begin();
    for (; itd != identifierArray.end(); ++itd) {
        if (*itd == str)
            break;
        location++;
    }
    if (itd == identifierArray.end()) {
        identifierArray.push_back(str);
        return location;
    }
    else
        return location;
}